

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::captureExpectedException(ResultBuilder *this,string *expectedMessage)

{
  undefined1 local_50 [24];
  _Alloc_hider _Stack_38;
  pointer local_30;
  
  if (expectedMessage->_M_string_length == 0) {
    local_50._8_4_ = 0;
    local_50._0_8_ = &PTR__AllOf_001826e8;
    local_50._16_8_ = (pointer)0x0;
    _Stack_38._M_p = (pointer)0x0;
    local_30 = (pointer)0x0;
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    Matchers::Impl::Generic::
    AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AllOf
              ((AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_50);
  }
  else {
    Matchers::Impl::StdString::Equals::Equals((Equals *)local_50,expectedMessage,Yes);
    captureExpectedException
              (this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_50);
    Matchers::Impl::StdString::Equals::~Equals((Equals *)local_50);
  }
  return;
}

Assistant:

void ResultBuilder::captureExpectedException(std::string const& expectedMessage) {
		if (expectedMessage.empty())
			captureExpectedException(Matchers::Impl::Generic::AllOf<std::string>());
		else
			captureExpectedException(Matchers::Equals(expectedMessage));
	}